

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O0

pel xGetLumaBorderPixel(int uiIdx,int bAbovePixel,int uiCWidth,int uiCHeight,int bAboveAvail,
                       int bLeftAvail,pel *luma)

{
  byte *pbVar1;
  int j;
  int i;
  pel dstPoint;
  pel *pSrc;
  int bLeftAvail_local;
  int bAboveAvail_local;
  int uiCHeight_local;
  int uiCWidth_local;
  int bAbovePixel_local;
  int uiIdx_local;
  
  j._3_1_ = 0xff;
  if (bAbovePixel == 0) {
    if ((bLeftAvail != 0) && (SBORROW4(uiIdx,uiCHeight * 2) != uiIdx + uiCHeight * -2 < 0)) {
      j._3_1_ = (pel)((int)((uint)luma[(long)-uiIdx + -1] + (uint)luma[(long)(-1 - uiIdx) + -1] + 1)
                     >> 1);
    }
  }
  else if ((bAboveAvail != 0) &&
          (pbVar1 = luma + 1, SBORROW4(uiIdx,uiCWidth * 2) != uiIdx + uiCWidth * -2 < 0)) {
    if ((uiIdx == 0) && (bLeftAvail == 0)) {
      j._3_1_ = (pel)((int)((uint)*pbVar1 * 3 + (uint)luma[2] + 2) >> 2);
    }
    else {
      j._3_1_ = (pel)((int)((uint)pbVar1[uiIdx] * 2 + (uint)pbVar1[uiIdx + -1] +
                            (uint)pbVar1[uiIdx + 1] + 2) >> 2);
    }
  }
  return j._3_1_;
}

Assistant:

pel xGetLumaBorderPixel(int uiIdx, int bAbovePixel, int uiCWidth, int uiCHeight, int bAboveAvail, int bLeftAvail, pel *luma)
{
    pel *pSrc = NULL;
    pel dstPoint = -1;

    if (bAbovePixel) {
        if (bAboveAvail) {
            pSrc = luma + 1;
            int i = uiIdx;
            if (i < (uiCWidth << 1)) {
                if (i == 0 && !bLeftAvail) {
                    dstPoint = (3 * pSrc[i] + pSrc[i + 1] + 2) >> 2;
                } else {
                    dstPoint = (2 * pSrc[i] + pSrc[i - 1] + pSrc[i + 1] + 2) >> 2;
                }
            }
        }
    } else {
        if (bLeftAvail) {
            pSrc = luma - 1;
            int j = uiIdx;
            if (j < (uiCHeight << 1)) {
                dstPoint = (pSrc[-j] + pSrc[-j - 1] + 1) >> 1;
            }
        }
    }
    uavs3d_assert(dstPoint >= 0);
    return dstPoint;
}